

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_shl_32(c_v64 a,uint n)

{
  c_v64 cVar1;
  uint in_ESI;
  undefined8 in_RDI;
  c_v64 t;
  int local_10;
  int iStack_c;
  
  if (0x1f < in_ESI) {
    fprintf(_stderr,"Error: undefined u32 shift left %d\n",(ulong)in_ESI);
    abort();
  }
  iStack_c = (int)((ulong)in_RDI >> 0x20);
  local_10 = (int)in_RDI;
  cVar1.u32[1] = iStack_c << ((byte)in_ESI & 0x1f);
  cVar1.u32[0] = local_10 << ((byte)in_ESI & 0x1f);
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift left %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] << n;
  t.u32[0] = a.u32[0] << n;
  return t;
}